

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  stbtt__buf idx;
  byte bVar1;
  stbtt_uint32 sVar2;
  long lVar3;
  stbtt__csctx *in_RDX;
  long in_RDI;
  stbtt__buf sVar4;
  int b1;
  float dy;
  float dx;
  float dy6;
  float dy5;
  float dy4;
  float dy3;
  float dy2;
  float dy1;
  float dx6;
  float dx5;
  float dx4;
  float dx3;
  float dx2;
  float dx1;
  float f;
  stbtt__buf b;
  stbtt__buf subrs;
  stbtt__buf subr_stack [10];
  float s [48];
  int clear_stack;
  int has_subrs;
  int b0;
  int i;
  int v;
  int sp;
  int subr_stack_height;
  int maskbits;
  int in_header;
  stbtt__buf *in_stack_fffffffffffffd48;
  int o;
  stbtt__csctx *in_stack_fffffffffffffd50;
  float dy_00;
  stbtt__buf *in_stack_fffffffffffffd58;
  float dx_00;
  undefined4 in_stack_fffffffffffffd60;
  float in_stack_fffffffffffffd64;
  float in_stack_fffffffffffffd68;
  float in_stack_fffffffffffffd6c;
  float in_stack_fffffffffffffd70;
  float in_stack_fffffffffffffd74;
  float in_stack_fffffffffffffd78;
  float in_stack_fffffffffffffd7c;
  stbtt__csctx *in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffdbc;
  float in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  uchar *local_210;
  uchar *local_200;
  int local_1f8;
  int iStack_1f4;
  uchar *local_1e0;
  long local_1d8;
  float local_1cc;
  stbtt__buf local_1c8;
  stbtt__buf local_1b8;
  long local_1a8 [20];
  float local_108 [5];
  int local_f4;
  int local_44;
  int local_40;
  uint local_3c;
  int local_38;
  int local_34;
  uint local_30;
  int local_2c;
  int local_28;
  int local_24;
  stbtt__csctx *local_20;
  long local_10;
  
  local_24 = 1;
  local_28 = 0;
  local_2c = 0;
  local_30 = 0;
  local_40 = 0;
  local_1b8.data = *(uchar **)(in_RDI + 0x70);
  local_1b8._8_8_ = *(undefined8 *)(in_RDI + 0x78);
  sVar4.data._4_4_ = in_stack_fffffffffffffd6c;
  sVar4.data._0_4_ = in_stack_fffffffffffffd68;
  sVar4.cursor = (int)in_stack_fffffffffffffd70;
  sVar4.size = (int)in_stack_fffffffffffffd74;
  local_20 = in_RDX;
  local_10 = in_RDI;
  sVar4 = stbtt__cff_index_get(sVar4,(int)in_stack_fffffffffffffd64);
  local_1e0 = sVar4.data;
  local_1c8.data = local_1e0;
  local_1d8 = sVar4._8_8_;
  local_1c8.cursor = (undefined4)local_1d8;
  local_1c8.size = local_1d8._4_4_;
  do {
    if (local_1c8.size <= local_1c8.cursor) {
      return 0;
    }
    local_38 = 0;
    local_44 = 1;
    bVar1 = stbtt__buf_get8(&local_1c8);
    local_3c = (uint)bVar1;
    o = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    dy_00 = SUB84(in_stack_fffffffffffffd58,0);
    dx_00 = (float)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    switch(local_3c) {
    case 1:
    case 3:
    case 0x12:
    case 0x17:
      local_28 = (int)local_30 / 2 + local_28;
      break;
    default:
      if (((local_3c != 0xff) && (local_3c != 0x1c)) && (local_3c < 0x20)) {
        return 0;
      }
      if (local_3c == 0xff) {
        sVar2 = stbtt__buf_get((stbtt__buf *)in_stack_fffffffffffffd50,o);
        local_1cc = (float)(int)sVar2 / 65536.0;
      }
      else {
        in_stack_fffffffffffffd48 = &local_1c8;
        stbtt__buf_skip((stbtt__buf *)in_stack_fffffffffffffd50,
                        (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        sVar2 = stbtt__cff_int(in_stack_fffffffffffffd58);
        local_1cc = (float)(int)(short)sVar2;
      }
      if (0x2f < (int)local_30) {
        return 0;
      }
      lVar3 = (long)(int)local_30;
      local_30 = local_30 + 1;
      local_108[lVar3] = local_1cc;
      local_44 = 0;
      break;
    case 4:
      local_24 = 0;
      if ((int)local_30 < 1) {
        return 0;
      }
      stbtt__csctx_rmove_to
                ((stbtt__csctx *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),dx_00
                 ,dy_00);
      break;
    case 5:
      if ((int)local_30 < 2) {
        return 0;
      }
      for (; local_38 + 1 < (int)local_30; local_38 = local_38 + 2) {
        stbtt__csctx_rline_to
                  ((stbtt__csctx *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                   (float)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                   SUB84(in_stack_fffffffffffffd58,0));
      }
      break;
    case 6:
      if ((int)local_30 < 1) {
        return 0;
      }
      for (; local_38 < (int)local_30; local_38 = local_38 + 1) {
        stbtt__csctx_rline_to
                  ((stbtt__csctx *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                   (float)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                   SUB84(in_stack_fffffffffffffd58,0));
        local_38 = local_38 + 1;
LAB_004da55f:
        if ((int)local_30 <= local_38) break;
        stbtt__csctx_rline_to
                  ((stbtt__csctx *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                   (float)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                   SUB84(in_stack_fffffffffffffd58,0));
      }
      break;
    case 7:
      if (0 < (int)local_30) goto LAB_004da55f;
      return 0;
    case 8:
      if ((int)local_30 < 6) {
        return 0;
      }
      for (; local_38 + 5 < (int)local_30; local_38 = local_38 + 6) {
        stbtt__csctx_rccurve_to
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
      }
      break;
    case 10:
      if (local_40 == 0) {
        if (*(int *)(local_10 + 0x9c) != 0) {
          sVar4 = stbtt__cid_get_glyph_subrs
                            ((stbtt_fontinfo *)
                             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                             in_stack_fffffffffffffdbc);
          local_200 = sVar4.data;
          local_1b8.data = local_200;
          _local_1f8 = sVar4._8_8_;
          local_1b8.cursor = local_1f8;
          local_1b8.size = iStack_1f4;
        }
        local_40 = 1;
      }
    case 0x1d:
      if ((int)local_30 < 1) {
        return 0;
      }
      local_30 = local_30 - 1;
      local_34 = (int)local_108[(int)local_30];
      if (9 < local_2c) {
        return 0;
      }
      lVar3 = (long)local_2c;
      local_2c = local_2c + 1;
      local_1a8[lVar3 * 2] = (long)local_1c8.data;
      local_1a8[lVar3 * 2 + 1] = local_1c8._8_8_;
      if (local_3c == 10) {
        in_stack_fffffffffffffd58 = &local_1b8;
      }
      else {
        in_stack_fffffffffffffd58 = (stbtt__buf *)(local_10 + 0x60);
      }
      idx.data._4_4_ = in_stack_fffffffffffffd6c;
      idx.data._0_4_ = in_stack_fffffffffffffd68;
      idx.cursor = (int)in_stack_fffffffffffffd70;
      idx.size = (int)in_stack_fffffffffffffd74;
      sVar4 = stbtt__get_subr(idx,(int)in_stack_fffffffffffffd64);
      local_210 = sVar4.data;
      local_1c8.data = local_210;
      local_1c8.size = sVar4.size;
      if (local_1c8.size == 0) {
        return 0;
      }
      local_1c8._8_8_ = (ulong)(uint)local_1c8.size << 0x20;
      local_44 = 0;
      break;
    case 0xb:
      if (local_2c < 1) {
        return 0;
      }
      local_2c = local_2c + -1;
      local_1c8.data = (uchar *)local_1a8[(long)local_2c * 2];
      local_1c8._8_8_ = local_1a8[(long)local_2c * 2 + 1];
      local_44 = 0;
      break;
    case 0xc:
      bVar1 = stbtt__buf_get8(&local_1c8);
      in_stack_fffffffffffffd50 = (stbtt__csctx *)(ulong)(bVar1 - 0x22);
      in_stack_fffffffffffffdc0 = local_108[3];
      switch(in_stack_fffffffffffffd50) {
      case (stbtt__csctx *)0x0:
        if ((int)local_30 < 7) {
          return 0;
        }
        in_stack_fffffffffffffdc0 = local_108[2];
        stbtt__csctx_rccurve_to
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
        stbtt__csctx_rccurve_to
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
        break;
      case (stbtt__csctx *)0x1:
        if ((int)local_30 < 0xd) {
          return 0;
        }
        in_stack_fffffffffffffdbc = local_f4;
        in_stack_fffffffffffffdc4 = local_108[1];
        stbtt__csctx_rccurve_to
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
        stbtt__csctx_rccurve_to
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
        break;
      case (stbtt__csctx *)0x2:
        if ((int)local_30 < 9) {
          return 0;
        }
        in_stack_fffffffffffffdc4 = local_108[1];
        stbtt__csctx_rccurve_to
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
        stbtt__csctx_rccurve_to
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
        break;
      case (stbtt__csctx *)0x3:
        if ((int)local_30 < 0xb) {
          return 0;
        }
        in_stack_fffffffffffffdbc = local_f4;
        in_stack_fffffffffffffdc4 = local_108[1];
        stbtt__csctx_rccurve_to
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
        stbtt__csctx_rccurve_to
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
        break;
      default:
        return 0;
      }
      break;
    case 0xe:
      stbtt__csctx_close_shape(in_stack_fffffffffffffd50);
      return 1;
    case 0x13:
    case 0x14:
      if (local_24 != 0) {
        local_28 = (int)local_30 / 2 + local_28;
      }
      local_24 = 0;
      stbtt__buf_skip((stbtt__buf *)in_stack_fffffffffffffd50,o);
      break;
    case 0x15:
      local_24 = 0;
      if ((int)local_30 < 2) {
        return 0;
      }
      stbtt__csctx_rmove_to
                ((stbtt__csctx *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),dx_00
                 ,dy_00);
      break;
    case 0x16:
      local_24 = 0;
      if ((int)local_30 < 1) {
        return 0;
      }
      stbtt__csctx_rmove_to
                ((stbtt__csctx *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),dx_00
                 ,dy_00);
      break;
    case 0x18:
      if ((int)local_30 < 8) {
        return 0;
      }
      for (; local_38 + 5 < (int)(local_30 - 2); local_38 = local_38 + 6) {
        stbtt__csctx_rccurve_to
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
      }
      if ((int)local_30 <= local_38 + 1) {
        return 0;
      }
      stbtt__csctx_rline_to
                ((stbtt__csctx *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (float)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                 SUB84(in_stack_fffffffffffffd58,0));
      break;
    case 0x19:
      if ((int)local_30 < 8) {
        return 0;
      }
      for (; local_38 + 1 < (int)(local_30 - 6); local_38 = local_38 + 2) {
        stbtt__csctx_rline_to
                  ((stbtt__csctx *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                   (float)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                   SUB84(in_stack_fffffffffffffd58,0));
      }
      if ((int)local_30 <= local_38 + 5) {
        return 0;
      }
      stbtt__csctx_rccurve_to
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                 in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                 in_stack_fffffffffffffd68);
      break;
    case 0x1a:
    case 0x1b:
      if ((int)local_30 < 4) {
        return 0;
      }
      if ((local_30 & 1) != 0) {
        local_38 = local_38 + 1;
      }
      for (; local_38 + 3 < (int)local_30; local_38 = local_38 + 4) {
        if (local_3c == 0x1b) {
          stbtt__csctx_rccurve_to
                    (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                     in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                     in_stack_fffffffffffffd68);
        }
        else {
          stbtt__csctx_rccurve_to
                    (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                     in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                     in_stack_fffffffffffffd68);
        }
      }
      break;
    case 0x1e:
      if ((int)local_30 < 4) {
        return 0;
      }
      for (; local_38 + 3 < (int)local_30; local_38 = local_38 + 4) {
        if (local_30 - local_38 == 5) {
          in_stack_fffffffffffffd7c = local_108[local_38 + 4];
        }
        else {
          in_stack_fffffffffffffd7c = 0.0;
        }
        in_stack_fffffffffffffd80 = local_20;
        stbtt__csctx_rccurve_to
                  (local_20,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
        local_38 = local_38 + 4;
LAB_004da6ec:
        if ((int)local_30 <= local_38 + 3) break;
        in_stack_fffffffffffffd68 = SUB84(local_20,0);
        in_stack_fffffffffffffd6c = (float)((ulong)local_20 >> 0x20);
        in_stack_fffffffffffffd70 = local_108[local_38];
        in_stack_fffffffffffffd74 = local_108[local_38 + 1];
        in_stack_fffffffffffffd78 = local_108[local_38 + 2];
        if (local_30 - local_38 == 5) {
          in_stack_fffffffffffffd64 = local_108[local_38 + 4];
        }
        else {
          in_stack_fffffffffffffd64 = 0.0;
        }
        stbtt__csctx_rccurve_to
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                   in_stack_fffffffffffffd68);
      }
      break;
    case 0x1f:
      if (3 < (int)local_30) goto LAB_004da6ec;
      return 0;
    }
    if (local_44 != 0) {
      local_30 = 0;
    }
  } while( true );
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // FALLTHROUGH
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && b0 < 32)
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}